

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIPSolution.cpp
# Opt level: O2

void __thiscall
BGIPSolution::BGIPSolution
          (BGIPSolution *this,Interface_ProblemToPolicyDiscretePure *pu,size_t nrDesiredSolutions)

{
  _Rb_tree_header *p_Var1;
  priority_queue<boost::shared_ptr<JPPVValuePair>,_std::vector<boost::shared_ptr<JPPVValuePair>,_std::allocator<boost::shared_ptr<JPPVValuePair>_>_>,_std::less<boost::shared_ptr<JPPVValuePair>_>_>
  *ppVar2;
  priority_queue<boost::shared_ptr<PartialJPDPValuePair>,_std::vector<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>,_std::less<boost::shared_ptr<PartialJPDPValuePair>_>_>
  *ppVar3;
  
  this->_m_pu = pu;
  (this->_m_puShared).px = (element_type *)0x0;
  (this->_m_puShared).pn.pi_ = (sp_counted_base *)0x0;
  this->_m_nrDesiredSolutions = nrDesiredSolutions;
  (this->_m_qFixedK)._m_l.
  super__List_base<boost::shared_ptr<JPPVValuePair>,_std::allocator<boost::shared_ptr<JPPVValuePair>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->_m_qFixedK;
  (this->_m_qFixedK)._m_l.
  super__List_base<boost::shared_ptr<JPPVValuePair>,_std::allocator<boost::shared_ptr<JPPVValuePair>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->_m_qFixedK;
  (this->_m_qFixedK)._m_l.
  super__List_base<boost::shared_ptr<JPPVValuePair>,_std::allocator<boost::shared_ptr<JPPVValuePair>_>_>
  ._M_impl._M_node._M_size = 0;
  (this->_m_qFixedK)._m_capacity = 0;
  (this->_m_qpFixedK)._m_l.
  super__List_base<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->_m_qpFixedK;
  (this->_m_qpFixedK)._m_l.
  super__List_base<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->_m_qpFixedK;
  (this->_m_qpFixedK)._m_l.
  super__List_base<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>
  ._M_impl._M_node._M_size = 0;
  (this->_m_qpFixedK)._m_capacity = 0;
  ppVar2 = (priority_queue<boost::shared_ptr<JPPVValuePair>,_std::vector<boost::shared_ptr<JPPVValuePair>,_std::allocator<boost::shared_ptr<JPPVValuePair>_>_>,_std::less<boost::shared_ptr<JPPVValuePair>_>_>
            *)operator_new(0x20);
  (ppVar2->c).
  super__Vector_base<boost::shared_ptr<JPPVValuePair>,_std::allocator<boost::shared_ptr<JPPVValuePair>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (ppVar2->c).
  super__Vector_base<boost::shared_ptr<JPPVValuePair>,_std::allocator<boost::shared_ptr<JPPVValuePair>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (ppVar2->c).
  super__Vector_base<boost::shared_ptr<JPPVValuePair>,_std::allocator<boost::shared_ptr<JPPVValuePair>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->_m_qInfSize = ppVar2;
  ppVar3 = (priority_queue<boost::shared_ptr<PartialJPDPValuePair>,_std::vector<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>,_std::less<boost::shared_ptr<PartialJPDPValuePair>_>_>
            *)operator_new(0x20);
  p_Var1 = &(this->_m_jpolIndices)._M_t._M_impl.super__Rb_tree_header;
  (ppVar3->c).
  super__Vector_base<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (ppVar3->c).
  super__Vector_base<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (ppVar3->c).
  super__Vector_base<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->_m_qpInfSize = ppVar3;
  (this->_m_jpolIndices)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_m_jpolIndices)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_m_jpolIndices)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_m_jpolIndices)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_m_jpolIndices)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->_m_issuedOverFlowWarning = false;
  SetNrDesiredSolutions(this,nrDesiredSolutions);
  return;
}

Assistant:

BGIPSolution::BGIPSolution(
        const Interface_ProblemToPolicyDiscretePure *pu,
        size_t nrDesiredSolutions
        ) :
    _m_pu(pu),
    _m_nrDesiredSolutions(nrDesiredSolutions),
    _m_qFixedK(FixedCapacityPriorityQueue<boost::shared_ptr<JPPVValuePair> >(0)),
    _m_qpFixedK(FixedCapacityPriorityQueue<boost::shared_ptr<PartialJPDPValuePair> >(0)),
    _m_qInfSize(new priority_queue<boost::shared_ptr<JPPVValuePair> >()),
    _m_qpInfSize(new priority_queue<boost::shared_ptr<PartialJPDPValuePair> >()),
    _m_issuedOverFlowWarning(false)
{
#if DBGIPSOL_LEAK
    std::cout << "Constructing BGIPSolution\n"<<std::endl;
#endif
    SetNrDesiredSolutions(_m_nrDesiredSolutions);
}